

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferFFS.cpp
# Opt level: O2

void __thiscall
adios2::format::BufferFFS::BufferFFS(BufferFFS *this,FFSBuffer Buf,void *data,size_t len)

{
  allocator local_49;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,"BufferFFS",&local_49);
  Buffer::Buffer(&this->super_Buffer,&local_48,len);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_Buffer)._vptr_Buffer = (_func_int **)&PTR__BufferFFS_00821cd0;
  this->m_buffer = Buf;
  this->m_data = data;
  return;
}

Assistant:

BufferFFS::BufferFFS(FFSBuffer Buf, void *data, size_t len) : Buffer("BufferFFS", len)
{
    m_buffer = Buf;
    m_data = data;
}